

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::
         do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  uint uVar1;
  long lVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar3;
  appender aVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char cVar9;
  char *pcVar10;
  int iVar11;
  uint uVar12;
  float_specs fVar13;
  float_specs fVar14;
  ulong uVar15;
  int iVar16;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_40_8_dbbf3351 write;
  undefined1 local_de [2];
  bool local_dc [4];
  bool local_d8 [4];
  sign_t local_d4;
  float_specs local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  char local_98;
  significand_type *local_90;
  decimal_fp<double> *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [24];
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  int *local_48;
  int *local_40;
  char *local_38;
  
  local_c8._0_8_ = fp->significand;
  lVar2 = 0x3f;
  if ((local_c8._0_8_ | 1) != 0) {
    for (; (local_c8._0_8_ | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  iVar16 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2] -
           (uint)((ulong)local_c8._0_8_ <
                 *(significand_type **)
                  (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                  (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar2] * 8));
  local_de[1] = '0';
  uVar1 = fspecs._4_4_;
  local_d4 = uVar1 >> 8 & 0xff;
  local_d8 = (bool  [4])iVar16;
  local_80 = (undefined1  [8])fspecs;
  if (iVar16 < 0) {
LAB_00115633:
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                ,0x195,"negative value");
  }
  fVar14.precision = (iVar16 + 1) - (uint)(local_d4 == none);
  fVar14._4_4_ = 0;
  local_de[0] = '.';
  local_78._8_8_ = local_c8._0_8_;
  fVar13 = fspecs;
  local_78._0_4_ = local_d4;
  if ((uVar1 >> 0x11 & 1) != 0) {
    local_d0 = fspecs;
    local_c8._8_4_ = local_d4;
    local_90 = (significand_type *)local_c8._0_8_;
    local_88 = fp;
    local_de[0] = decimal_point_impl<char>(loc);
    fp = local_88;
    local_78._8_8_ = local_90;
    fVar13 = local_d0;
    local_78._0_4_ = local_c8._8_4_;
  }
  iVar6 = fp->exponent;
  local_c8._12_4_ = iVar16 + iVar6;
  iVar11 = fVar13.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00115375:
    iVar6 = iVar16 + iVar6 + -1;
    if ((uVar1 >> 0x14 & 1) == 0) {
      iVar7 = 0;
      if (iVar16 == 1) {
        local_de[0] = '\0';
        iVar7 = 0;
      }
    }
    else {
      iVar7 = 0;
      if (0 < iVar11 - iVar16) {
        iVar7 = iVar11 - iVar16;
      }
      fVar14.precision = fVar14.precision + iVar7;
      fVar14._4_4_ = 0;
    }
    local_78[0x14] = local_de[0];
    local_78._16_4_ = iVar16;
    local_60._0_5_ = CONCAT14('0',iVar7);
    local_60 = (decimal_fp<double> *)
               (CONCAT26(local_60._6_2_,
                         CONCAT15(((uVar1 >> 0x10 & 1) == 0) << 5,(undefined5)local_60)) |
               0x450000000000);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_58._4_4_,iVar6);
    if (0 < specs->width) {
      if ((int)local_c8._12_4_ < 1) {
        iVar6 = 1 - local_c8._12_4_;
      }
      lVar2 = 2;
      if (99 < iVar6) {
        lVar2 = (ulong)(999 < iVar6) + 3;
      }
      sVar5 = (long)fVar14 + (3 - (ulong)(local_de[0] == '\0')) + lVar2;
      aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_&>
                        (out,specs,sVar5,sVar5,(anon_class_40_8_dbbf3351 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    aVar4 = do_write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<double>,_char,_fmt::v8::detail::digit_grouping<char>_>
            ::anon_class_40_8_dbbf3351::operator()
                      ((anon_class_40_8_dbbf3351 *)local_78,
                       (iterator)
                       out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
           aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar7 = 0x10;
    if (0 < iVar11) {
      iVar7 = iVar11;
    }
    if (((int)local_c8._12_4_ < -3) || (iVar7 < (int)local_c8._12_4_)) goto LAB_00115375;
  }
  if (iVar6 < 0) {
    if ((int)local_c8._12_4_ < 1) {
      iVar6 = -local_c8._12_4_;
      local_b8._M_allocated_capacity._0_4_ = iVar6;
      if (SBORROW4(iVar11,iVar6) != iVar11 + local_c8._12_4_ < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar11;
      }
      if (iVar11 < 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar6;
      }
      if (iVar16 != 0) {
        local_b8._M_allocated_capacity._0_4_ = iVar6;
      }
      if (iVar16 == 0 && local_b8._M_allocated_capacity._0_4_ == 0) {
        local_dc[0] = (bool)(char)((uVar1 & 0x100000) >> 0x14);
        iVar16 = 2 - (uint)(((ulong)fspecs & 0x10000000000000) == 0);
      }
      else {
        local_dc[0] = true;
        iVar16 = 2;
        if ((int)local_b8._M_allocated_capacity._0_4_ < 0) goto LAB_00115633;
      }
      sVar5 = (ulong)(uint)(iVar16 + local_b8._M_allocated_capacity._0_4_) + (long)fVar14;
      local_78._0_8_ = local_de + 10;
      local_78._8_8_ = local_de + 1;
      local_78._16_8_ = local_de + 2;
      local_60 = (decimal_fp<double> *)local_de;
      local_58 = &local_b8;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_c8;
      local_48 = (int *)(local_de + 6);
      aVar4 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_4_&>
                        (out,specs,sVar5,sVar5,(anon_class_56_7_162c6e41 *)local_78);
      return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
             aVar4.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    }
    iVar6 = 0;
    local_dc = (bool  [4])(iVar11 - iVar16 & (int)(uVar1 << 0xb) >> 0x1f);
    uVar12 = (uint)local_dc;
    if ((int)local_dc < 1) {
      uVar12 = 0;
    }
    local_d0 = fVar14;
    digit_grouping<char>::digit_grouping
              ((digit_grouping<char> *)&local_b8,loc,(bool)((byte)(uVar1 >> 0x11) & 1));
    if (local_98 != '\0') {
      pcVar8 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_);
      pcVar10 = pcVar8 + local_b8._8_8_;
      lVar2 = 0;
      do {
        if (pcVar8 == pcVar10) {
          cVar9 = pcVar10[-1];
          pcVar8 = pcVar10;
        }
        else {
          cVar9 = *pcVar8;
          if ((byte)(cVar9 + 0x81U) < 0x82) goto LAB_00115650;
          pcVar8 = pcVar8 + 1;
        }
        iVar6 = iVar6 + cVar9;
        if ((int)local_d8 <= iVar6) goto LAB_00115650;
        lVar2 = lVar2 + 1;
      } while( true );
    }
    lVar2 = 0;
LAB_00115650:
    sVar5 = (ulong)uVar12 + (long)local_d0 + lVar2 + 1;
    local_78._0_8_ = local_de + 10;
    local_78._8_8_ = local_c8;
    local_78._16_8_ = local_de + 6;
    local_60 = (decimal_fp<double> *)(local_c8 + 0xc);
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_de;
    local_48 = (int *)(local_de + 2);
    local_40 = (int *)(local_de + 1);
    local_50 = &local_b8;
    bVar3.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_3_&>
                   (out,specs,sVar5,sVar5,(anon_class_64_8_e6ffa566 *)local_78);
    goto LAB_001156b3;
  }
  uVar15 = (ulong)(iVar6 + fVar14.precision);
  local_dc = (bool  [4])(iVar11 - local_c8._12_4_);
  if ((uVar1 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_dc) {
      if ((int)local_dc < 1) goto LAB_0011552e;
    }
    else {
      local_dc[0] = true;
      local_dc[1] = false;
      local_dc[2] = false;
      local_dc[3] = false;
    }
    uVar15 = uVar15 + (uint)local_dc + 1;
  }
LAB_0011552e:
  digit_grouping<char>::digit_grouping
            ((digit_grouping<char> *)&local_b8,loc,(bool)((byte)(uVar1 >> 0x11) & 1));
  iVar16 = 0;
  if (local_98 != '\0') {
    pcVar8 = (char *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                              local_b8._M_allocated_capacity._0_4_);
    pcVar10 = pcVar8 + local_b8._8_8_;
    lVar2 = 0;
    do {
      if (pcVar8 == pcVar10) {
        cVar9 = pcVar10[-1];
        pcVar8 = pcVar10;
      }
      else {
        cVar9 = *pcVar8;
        if ((byte)(cVar9 + 0x81U) < 0x82) goto LAB_0011559f;
        pcVar8 = pcVar8 + 1;
      }
      iVar16 = iVar16 + cVar9;
      if ((int)local_d8 <= iVar16) goto LAB_0011559f;
      lVar2 = lVar2 + 1;
    } while( true );
  }
  lVar2 = 0;
LAB_0011559f:
  local_78._0_8_ = local_de + 10;
  local_78._8_8_ = local_c8;
  local_78._16_8_ = local_de + 6;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_80;
  local_48 = (int *)local_de;
  local_40 = (int *)(local_de + 2);
  local_38 = local_de + 1;
  local_60 = fp;
  local_58 = &local_b8;
  bVar3.container =
       (buffer<char> *)
       write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::do_write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>,char,fmt::v8::detail::digit_grouping<char>>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<double>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_2_&>
                 (out,specs,uVar15 + lVar2,uVar15 + lVar2,(anon_class_72_9_d68ba176 *)local_78);
LAB_001156b3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b8._M_allocated_capacity._4_4_,local_b8._M_allocated_capacity._0_4_) !=
      &local_a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_b8._M_allocated_capacity._4_4_,
                                local_b8._M_allocated_capacity._0_4_),
                    local_a8._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}